

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O1

string * __thiscall
assembler::asmcode::operand_to_string_abi_cxx11_
          (string *__return_storage_ptr__,asmcode *this,operand op)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "EMPTY";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "AL";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "AH";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "BL";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "BH";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "CL";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "CH";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "DL";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "DH";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "RAX";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "RBX";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "RCX";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "RDX";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "RSI";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "RDI";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "RSP";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "RBP";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "R8";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "R9";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "R10";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "R11";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "R12";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "R13";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "R14";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "R15";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "MEM_RAX";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "MEM_RBX";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "MEM_RCX";
    pcVar1 = "";
    break;
  case 0x1c:
    pcVar2 = "MEM_RDX";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "MEM_RDI";
    pcVar1 = "";
    break;
  case 0x1e:
    pcVar2 = "MEM_RSI";
    pcVar1 = "";
    break;
  case 0x1f:
    pcVar2 = "MEM_RSP";
    pcVar1 = "";
    break;
  case 0x20:
    pcVar2 = "MEM_RBP";
    pcVar1 = "";
    break;
  case 0x21:
    pcVar2 = "MEM_R8";
    pcVar1 = "";
    break;
  case 0x22:
    pcVar2 = "MEM_R9";
    pcVar1 = "";
    break;
  case 0x23:
    pcVar2 = "MEM_R10";
    pcVar1 = "";
    break;
  case 0x24:
    pcVar2 = "MEM_R11";
    pcVar1 = "";
    break;
  case 0x25:
    pcVar2 = "MEM_R12";
    pcVar1 = "";
    break;
  case 0x26:
    pcVar2 = "MEM_R13";
    pcVar1 = "";
    break;
  case 0x27:
    pcVar2 = "MEM_R14";
    pcVar1 = "";
    break;
  case 0x28:
    pcVar2 = "MEM_R15";
    pcVar1 = "";
    break;
  case 0x29:
    pcVar2 = "BYTE_MEM_RAX";
    pcVar1 = "";
    break;
  case 0x2a:
    pcVar2 = "BYTE_MEM_RBX";
    pcVar1 = "";
    break;
  case 0x2b:
    pcVar2 = "BYTE_MEM_RCX";
    pcVar1 = "";
    break;
  case 0x2c:
    pcVar2 = "BYTE_MEM_RDX";
    pcVar1 = "";
    break;
  case 0x2d:
    pcVar2 = "BYTE_MEM_RDI";
    pcVar1 = "";
    break;
  case 0x2e:
    pcVar2 = "BYTE_MEM_RSI";
    pcVar1 = "";
    break;
  case 0x2f:
    pcVar2 = "BYTE_MEM_RSP";
    pcVar1 = "";
    break;
  case 0x30:
    pcVar2 = "BYTE_MEM_RBP";
    pcVar1 = "";
    break;
  case 0x31:
    pcVar2 = "BYTE_MEM_R8";
    pcVar1 = "";
    break;
  case 0x32:
    pcVar2 = "BYTE_MEM_R9";
    pcVar1 = "";
    break;
  case 0x33:
    pcVar2 = "BYTE_MEM_R10";
    pcVar1 = "";
    break;
  case 0x34:
    pcVar2 = "BYTE_MEM_R11";
    pcVar1 = "";
    break;
  case 0x35:
    pcVar2 = "BYTE_MEM_R12";
    pcVar1 = "";
    break;
  case 0x36:
    pcVar2 = "BYTE_MEM_R13";
    pcVar1 = "";
    break;
  case 0x37:
    pcVar2 = "BYTE_MEM_R14";
    pcVar1 = "";
    break;
  case 0x38:
    pcVar2 = "BYTE_MEM_R15";
    pcVar1 = "";
    break;
  case 0x39:
    pcVar2 = "NUMBER";
    pcVar1 = "";
    break;
  case 0x3a:
    pcVar2 = "ST0";
    pcVar1 = "";
    break;
  case 0x3b:
    pcVar2 = "ST1";
    pcVar1 = "";
    break;
  case 0x3c:
    pcVar2 = "ST2";
    pcVar1 = "";
    break;
  case 0x3d:
    pcVar2 = "ST3";
    pcVar1 = "";
    break;
  case 0x3e:
    pcVar2 = "ST4";
    pcVar1 = "";
    break;
  case 0x3f:
    pcVar2 = "ST5";
    pcVar1 = "";
    break;
  case 0x40:
    pcVar2 = "ST6";
    pcVar1 = "";
    break;
  case 0x41:
    pcVar2 = "ST7";
    pcVar1 = "";
    break;
  case 0x42:
    pcVar2 = "LABELADDRESS";
    pcVar1 = "";
    break;
  case 0x43:
    pcVar2 = "XMM0";
    pcVar1 = "";
    break;
  case 0x44:
    pcVar2 = "XMM1";
    pcVar1 = "";
    break;
  case 0x45:
    pcVar2 = "XMM2";
    pcVar1 = "";
    break;
  case 0x46:
    pcVar2 = "XMM3";
    pcVar1 = "";
    break;
  case 0x47:
    pcVar2 = "XMM4";
    pcVar1 = "";
    break;
  case 0x48:
    pcVar2 = "XMM5";
    pcVar1 = "";
    break;
  case 0x49:
    pcVar2 = "XMM6";
    pcVar1 = "";
    break;
  case 0x4a:
    pcVar2 = "XMM7";
    pcVar1 = "";
    break;
  case 0x4b:
    pcVar2 = "XMM8";
    pcVar1 = "";
    break;
  case 0x4c:
    pcVar2 = "XMM9";
    pcVar1 = "";
    break;
  case 0x4d:
    pcVar2 = "XMM10";
    pcVar1 = "";
    break;
  case 0x4e:
    pcVar2 = "XMM11";
    pcVar1 = "";
    break;
  case 0x4f:
    pcVar2 = "XMM12";
    pcVar1 = "";
    break;
  case 0x50:
    pcVar2 = "XMM13";
    pcVar1 = "";
    break;
  case 0x51:
    pcVar2 = "XMM14";
    pcVar1 = "";
    break;
  case 0x52:
    pcVar2 = "XMM15";
    pcVar1 = "";
    break;
  default:
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string asmcode::operand_to_string(operand op)
  {
  switch (op)
    {
    case asmcode::EMPTY: return std::string("EMPTY");
    case asmcode::AL: return std::string("AL");
    case asmcode::AH: return std::string("AH");
    case asmcode::BL: return std::string("BL");
    case asmcode::BH: return std::string("BH");
    case asmcode::CL: return std::string("CL");
    case asmcode::CH: return std::string("CH");
    case asmcode::DL: return std::string("DL");
    case asmcode::DH: return std::string("DH");   
    case asmcode::RAX: return std::string("RAX");
    case asmcode::RBX: return std::string("RBX");
    case asmcode::RCX: return std::string("RCX");
    case asmcode::RDX: return std::string("RDX");
    case asmcode::RDI: return std::string("RDI");
    case asmcode::RSI: return std::string("RSI");
    case asmcode::RSP: return std::string("RSP");
    case asmcode::RBP: return std::string("RBP");
    case asmcode::R8:  return std::string("R8");
    case asmcode::R9:  return std::string("R9");
    case asmcode::R10: return std::string("R10");
    case asmcode::R11: return std::string("R11");
    case asmcode::R12: return std::string("R12");
    case asmcode::R13: return std::string("R13");
    case asmcode::R14: return std::string("R14");
    case asmcode::R15: return std::string("R15");  
    case asmcode::MEM_RAX: return std::string("MEM_RAX");
    case asmcode::MEM_RBX: return std::string("MEM_RBX");
    case asmcode::MEM_RCX: return std::string("MEM_RCX");
    case asmcode::MEM_RDX: return std::string("MEM_RDX");
    case asmcode::MEM_RDI: return std::string("MEM_RDI");
    case asmcode::MEM_RSI: return std::string("MEM_RSI");
    case asmcode::MEM_RSP: return std::string("MEM_RSP");
    case asmcode::MEM_RBP: return std::string("MEM_RBP");
    case asmcode::MEM_R8:  return std::string("MEM_R8");
    case asmcode::MEM_R9:  return std::string("MEM_R9");
    case asmcode::MEM_R10: return std::string("MEM_R10");
    case asmcode::MEM_R11: return std::string("MEM_R11");
    case asmcode::MEM_R12: return std::string("MEM_R12");
    case asmcode::MEM_R13: return std::string("MEM_R13");
    case asmcode::MEM_R14: return std::string("MEM_R14");
    case asmcode::MEM_R15: return std::string("MEM_R15");
    case asmcode::BYTE_MEM_RAX: return std::string("BYTE_MEM_RAX");
    case asmcode::BYTE_MEM_RBX: return std::string("BYTE_MEM_RBX");
    case asmcode::BYTE_MEM_RCX: return std::string("BYTE_MEM_RCX");
    case asmcode::BYTE_MEM_RDX: return std::string("BYTE_MEM_RDX");
    case asmcode::BYTE_MEM_RDI: return std::string("BYTE_MEM_RDI");
    case asmcode::BYTE_MEM_RSI: return std::string("BYTE_MEM_RSI");
    case asmcode::BYTE_MEM_RSP: return std::string("BYTE_MEM_RSP");
    case asmcode::BYTE_MEM_RBP: return std::string("BYTE_MEM_RBP");
    case asmcode::BYTE_MEM_R8:  return std::string("BYTE_MEM_R8");
    case asmcode::BYTE_MEM_R9:  return std::string("BYTE_MEM_R9");
    case asmcode::BYTE_MEM_R10: return std::string("BYTE_MEM_R10");
    case asmcode::BYTE_MEM_R11: return std::string("BYTE_MEM_R11");
    case asmcode::BYTE_MEM_R12: return std::string("BYTE_MEM_R12");
    case asmcode::BYTE_MEM_R13: return std::string("BYTE_MEM_R13");
    case asmcode::BYTE_MEM_R14: return std::string("BYTE_MEM_R14");
    case asmcode::BYTE_MEM_R15: return std::string("BYTE_MEM_R15");  
    case asmcode::NUMBER: return std::string("NUMBER");
    case asmcode::ST0:  return std::string("ST0");
    case asmcode::ST1:  return std::string("ST1");
    case asmcode::ST2:  return std::string("ST2");
    case asmcode::ST3:  return std::string("ST3");
    case asmcode::ST4:  return std::string("ST4");
    case asmcode::ST5:  return std::string("ST5");
    case asmcode::ST6:  return std::string("ST6");
    case asmcode::ST7:  return std::string("ST7");
    case asmcode::XMM0: return std::string("XMM0");
    case asmcode::XMM1: return std::string("XMM1");
    case asmcode::XMM2: return std::string("XMM2");
    case asmcode::XMM3: return std::string("XMM3");
    case asmcode::XMM4: return std::string("XMM4");
    case asmcode::XMM5: return std::string("XMM5");
    case asmcode::XMM6: return std::string("XMM6");
    case asmcode::XMM7: return std::string("XMM7");
    case asmcode::XMM8: return std::string("XMM8");
    case asmcode::XMM9: return std::string("XMM9");
    case asmcode::XMM10:return std::string("XMM10");
    case asmcode::XMM11:return std::string("XMM11");
    case asmcode::XMM12:return std::string("XMM12");
    case asmcode::XMM13:return std::string("XMM13");
    case asmcode::XMM14:return std::string("XMM14");
    case asmcode::XMM15:return std::string("XMM15");   
    case asmcode::LABELADDRESS: return std::string("LABELADDRESS");
    }
  return std::string();
  }